

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O3

void phyr::sortSampleSpace(double *lambda,double *v,int n)

{
  pointer ppVar1;
  pointer ppVar2;
  long lVar3;
  ulong uVar4;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> data;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_58;
  pair<double,_double> local_40;
  
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            (&local_58,(long)n,(allocator_type *)&local_40);
  if (0 < n) {
    uVar4 = 0;
    do {
      local_40.first = lambda[uVar4];
      local_40.second = v[uVar4];
      if (local_58.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_58.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
        _M_realloc_insert<std::pair<double,double>>
                  ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                   &local_58,
                   (iterator)
                   local_58.
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_40);
      }
      else {
        (local_58.
         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_finish)->first = local_40.first;
        (local_58.
         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_finish)->second = local_40.second;
        local_58.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_58.
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      uVar4 = uVar4 + 1;
    } while ((uint)n != uVar4);
  }
  ppVar2 = local_58.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar1 = local_58.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_58.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_58.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar4 = (long)local_58.
                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_58.
                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,double>*,std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_58.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_58.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,double>*,std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar1,ppVar2);
  }
  if (n < 1) {
    if (local_58.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_start == (pair<double,_double> *)0x0) {
      return;
    }
  }
  else {
    lVar3 = 0;
    do {
      *(undefined8 *)((long)lambda + lVar3) =
           *(undefined8 *)
            ((long)&(local_58.
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->first + lVar3 * 2);
      *(undefined8 *)((long)v + lVar3) =
           *(undefined8 *)
            ((long)&(local_58.
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second + lVar3 * 2);
      lVar3 = lVar3 + 8;
    } while ((ulong)(uint)n << 3 != lVar3);
  }
  operator_delete(local_58.
                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void sortSampleSpace(Real* lambda, Real* v, int n) {
    std::vector<std::pair<Real, Real>> data(n);

    // Populate data
    for (int i = 0; i < n; i++)
        data.push_back(std::make_pair(lambda[i], v[i]));
    std::sort(data.begin(), data.end());

    // Restore sorted data
    for (int i = 0; i < n; i++) {
        lambda[i] = data[i].first;
        v[i] = data[i].second;
    }
}